

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

void hydro_random_ensure_initialized(void)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ssize_t sVar5;
  uchar *buf;
  undefined8 *__buf;
  size_t __nbytes;
  long *in_FS_OFFSET;
  pollfd local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  long local_38;
  
  if ((char)in_FS_OFFSET[-1] != '\0') {
    return;
  }
  lVar1 = *in_FS_OFFSET;
  iVar2 = open("/dev/random",0);
  if (iVar2 != -1) {
    local_70.events = 1;
    local_70.revents = 0;
    local_70.fd = iVar2;
    do {
      iVar3 = poll(&local_70,1,-1);
      if (-1 < iVar3) {
        if (iVar3 == 1) {
          iVar2 = close(iVar2);
          if (iVar2 == 0) goto LAB_00104680;
          goto LAB_001046ae;
        }
        break;
      }
      piVar4 = __errno_location();
    } while ((*piVar4 == 4) || (*piVar4 == 0xb));
    close(iVar2);
    piVar4 = __errno_location();
    *piVar4 = 5;
    abort();
  }
LAB_00104680:
  iVar2 = -1;
  do {
    iVar3 = open("/dev/urandom",0);
    if (iVar3 != -1) {
      __buf = &local_68;
      __nbytes = 0x38;
      goto LAB_001046be;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  goto LAB_001046ae;
  while( true ) {
    if (sVar5 == 0) break;
    __buf = (undefined8 *)((long)__buf + sVar5);
    __nbytes = __nbytes - sVar5;
    if (__nbytes == 0) break;
LAB_001046be:
    sVar5 = read(iVar3,__buf,__nbytes);
    if (sVar5 < 0) {
      piVar4 = __errno_location();
      if ((*piVar4 != 4) && (*piVar4 != 0xb)) goto LAB_0010472d;
      goto LAB_001046be;
    }
  }
  if ((long)__buf - (long)&local_68 == 0x38) {
    *(undefined8 *)(lVar1 + -0x30) = uStack_58;
    *(undefined8 *)(lVar1 + -0x28) = uStack_50;
    *(undefined8 *)(lVar1 + -0x20) = uStack_48;
    *(undefined8 *)(lVar1 + -0x18) = uStack_40;
    *(undefined8 *)(lVar1 + -0x40) = local_68;
    *(undefined8 *)(lVar1 + -0x38) = uStack_60;
    *(undefined8 *)(lVar1 + -0x30) = uStack_58;
    *(undefined8 *)(lVar1 + -0x28) = uStack_50;
    in_FS_OFFSET[-2] = local_38;
    hydro_memzero(&local_68,0x38);
    iVar2 = 0;
  }
LAB_0010472d:
  iVar3 = close(iVar3);
  if (iVar3 == 0 && iVar2 == 0) {
    gimli_core_u8((uint8_t *)(lVar1 + -0x40),'\0');
    hydro_random_ratchet();
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    return;
  }
LAB_001046ae:
  abort();
}

Assistant:

static void
hydro_random_ensure_initialized(void)
{
    if (hydro_random_context.initialized == 0) {
        if (hydro_random_init() != 0) {
            abort();
        }
        gimli_core_u8(hydro_random_context.state, 0);
        hydro_random_ratchet();
        hydro_random_context.initialized = 1;
    }
}